

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void fmt::v7::print<std::basic_string_view<char,std::char_traits<char>>,unsigned_int_const&,char>
               (FILE *f,basic_string_view<char,_std::char_traits<char>_> *format_str,uint *args)

{
  basic_string_view<char,_std::char_traits<char>_> *f_00;
  remove_reference_t<const_unsigned_int_&> *in_RCX;
  char *extraout_RDX;
  std_string_view<char> s;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_98;
  v7 *local_88;
  size_t local_80;
  string_view local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int>
  *local_68 [3];
  FILE *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int>
  *vargs;
  uint *args_local;
  basic_string_view<char,_std::char_traits<char>_> *format_str_local;
  FILE *f_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  FILE *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  FILE *local_10;
  
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int>
           *)args;
  args_local = (uint *)format_str;
  format_str_local = (basic_string_view<char,_std::char_traits<char>_> *)f;
  local_68[0] = make_args_checked<unsigned_int_const&,std::basic_string_view<char,std::char_traits<char>>,char>
                          ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int>
                            *)format_str,(v7 *)args,
                           (basic_string_view<char,_std::char_traits<char>_> *)args,in_RCX);
  f_00 = format_str_local;
  local_50 = (FILE *)local_68;
  local_88 = *(v7 **)args_local;
  local_80 = *(size_t *)(args_local + 2);
  s._M_str = extraout_RDX;
  s._M_len = local_80;
  local_78 = to_string_view<char,_0>(local_88,s);
  local_28 = &local_98;
  f_local = local_50;
  local_20 = local_50;
  local_10 = local_50;
  local_18 = local_28;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_28,2,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_50);
  vprint((FILE *)f_00,local_78,(format_args)local_98);
  return;
}

Assistant:

inline void print(std::FILE* f, const S& format_str, Args&&... args) {
  const auto& vargs = fmt::make_args_checked<Args...>(format_str, args...);
  return detail::is_unicode<Char>()
             ? vprint(f, to_string_view(format_str), vargs)
             : detail::vprint_mojibake(f, to_string_view(format_str), vargs);
}